

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O2

int ffu8fr8(ULONGLONG *input,long ntodo,double scale,double zero,double *output,int *status)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  if (0 < ntodo) {
    lVar1 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      output[lVar2] =
           ((((double)CONCAT44(0x45300000,(int)(input[lVar2] >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)input[lVar2]) - 4503599627370496.0)) - zero) / scale;
    }
  }
  else {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      output[lVar2] =
           ((double)CONCAT44(0x45300000,(int)(input[lVar2] >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)input[lVar2]) - 4503599627370496.0);
    }
  }
  return *status;
}

Assistant:

int ffu8fr8(ULONGLONG *input,  /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            double *output,    /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
                output[ii] = (double) input[ii];
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (input[ii] - zero) / scale;
    }
    return(*status);
}